

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

uint __thiscall llvm::yaml::Scanner::scanBlockIndentationIndicator(Scanner *this)

{
  uint local_14;
  uint Indent;
  Scanner *this_local;
  
  local_14 = 0;
  if (((this->Current != this->End) && ('0' < *this->Current)) && (*this->Current < ':')) {
    local_14 = (int)*this->Current - 0x30;
    skip(this,1);
  }
  return local_14;
}

Assistant:

unsigned Scanner::scanBlockIndentationIndicator() {
  unsigned Indent = 0;
  if (Current != End && (*Current >= '1' && *Current <= '9')) {
    Indent = unsigned(*Current - '0');
    skip(1);
  }
  return Indent;
}